

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O3

PriceField __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeAsDouble
          (PriceUpdateDecoder *this,ByteBuffer *buffer,FieldDef *field_def)

{
  FieldEncodingEnum FVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_00;
  anon_union_8_4_08ebdfac_for_PriceField_2 aVar4;
  float fVar5;
  double value;
  PriceField PVar6;
  
  FVar1 = field_def->encoding_;
  if (FVar1 < VARINT) {
    if (FVar1 == FIXED4) {
      fVar5 = tools::ByteBuffer::ReadFloat(buffer);
      value = (double)fVar5;
    }
    else {
      if (FVar1 != FIXED8) {
LAB_001b0fa7:
        uVar2 = tools::Varint::ReadU32(&buffer->super_InputStream);
        tools::ByteBuffer::Seek(buffer,(ulong)uVar2);
        PriceField::PriceField((PriceField *)this);
        aVar4 = extraout_RDX;
        goto LAB_001b0fed;
      }
      value = tools::ByteBuffer::ReadDouble(buffer);
    }
  }
  else {
    if (FVar1 == VARINT) {
      uVar3 = tools::Varint::ReadU64(&buffer->super_InputStream);
    }
    else {
      if (FVar1 != ZIGZAG) goto LAB_001b0fa7;
      uVar3 = tools::Varint::ReadU64(&buffer->super_InputStream);
      uVar3 = tools::Varint::ZigzagToLong(uVar3);
    }
    value = EncodingUtil::DecodeDecimal(uVar3,field_def->scale_);
  }
  PriceField::PriceField((PriceField *)this,value);
  aVar4 = extraout_RDX_00;
LAB_001b0fed:
  PVar6.field_1.long_value_ = aVar4.long_value_;
  PVar6._0_8_ = this;
  return PVar6;
}

Assistant:

PriceField PriceUpdateDecoder::DecodeAsDouble(ByteBuffer& buffer, FieldDef& field_def)
{
    switch(field_def.encoding_)
    {
        case FIXED4:
            return PriceField((double) buffer.ReadFloat());
        case FIXED8:
            return PriceField(buffer.ReadDouble());
        case VARINT:
            return PriceField(EncodingUtil::DecodeDecimal(Varint::ReadU64(buffer), field_def.scale_));
        case ZIGZAG:
            return PriceField(EncodingUtil::DecodeDecimal(Varint::ZigzagToLong(Varint::ReadU64(buffer)), field_def.scale_));
    }
    SkipFieldValue(buffer, field_def);
    return PriceField();
}